

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::AddFoldedRange(CharClassBuilder *cc,Rune lo,Rune hi,int depth)

{
  bool bVar1;
  CaseFold *pCVar2;
  uint uVar3;
  int iVar4;
  uint r;
  LogMessage local_1b0;
  
  if (depth < 0xb) {
    bVar1 = CharClassBuilder::AddRange(cc,lo,hi);
    if (bVar1) {
      while (r = lo, (int)r <= hi) {
        pCVar2 = LookupCaseFold((CaseFold *)unicode_casefold,0x164,r);
        if (pCVar2 == (CaseFold *)0x0) {
          return;
        }
        lo = pCVar2->lo;
        if (pCVar2->lo <= (int)r) {
          iVar4 = pCVar2->delta;
          uVar3 = pCVar2->hi;
          if (hi <= pCVar2->hi) {
            uVar3 = hi;
          }
          if (iVar4 == -1) {
            iVar4 = (r & 1) - 1;
            uVar3 = uVar3 + ((uVar3 & 0x80000001) == 1);
          }
          else if (iVar4 == 1) {
            iVar4 = -(uint)((r & 0x80000001) == 1);
            uVar3 = uVar3 | 1;
          }
          else {
            uVar3 = uVar3 + iVar4;
          }
          AddFoldedRange(cc,iVar4 + r,uVar3,depth + 1);
          lo = pCVar2->hi + 1;
        }
      }
    }
  }
  else {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
               ,0x15f);
    std::operator<<((ostream *)&local_1b0.str_,"AddFoldedRange recurses too much.");
    LogMessage::~LogMessage(&local_1b0);
  }
  return;
}

Assistant:

static void AddFoldedRange(CharClassBuilder* cc, Rune lo, Rune hi, int depth) {
  // AddFoldedRange calls itself recursively for each rune in the fold cycle.
  // Most folding cycles are small: there aren't any bigger than four in the
  // current Unicode tables.  make_unicode_casefold.py checks that
  // the cycles are not too long, and we double-check here using depth.
  if (depth > 10) {
    LOG(DFATAL) << "AddFoldedRange recurses too much.";
    return;
  }

  if (!cc->AddRange(lo, hi))  // lo-hi was already there? we're done
    return;

  while (lo <= hi) {
    const CaseFold* f = LookupCaseFold(unicode_casefold, num_unicode_casefold, lo);
    if (f == NULL)  // lo has no fold, nor does anything above lo
      break;
    if (lo < f->lo) {  // lo has no fold; next rune with a fold is f->lo
      lo = f->lo;
      continue;
    }

    // Add in the result of folding the range lo - f->hi
    // and that range's fold, recursively.
    Rune lo1 = lo;
    Rune hi1 = std::min<Rune>(hi, f->hi);
    switch (f->delta) {
      default:
        lo1 += f->delta;
        hi1 += f->delta;
        break;
      case EvenOdd:
        if (lo1%2 == 1)
          lo1--;
        if (hi1%2 == 0)
          hi1++;
        break;
      case OddEven:
        if (lo1%2 == 0)
          lo1--;
        if (hi1%2 == 1)
          hi1++;
        break;
    }
    AddFoldedRange(cc, lo1, hi1, depth+1);

    // Pick up where this fold left off.
    lo = f->hi + 1;
  }
}